

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_text_l(archive_acl *acl,wchar_t flags,char **acl_text,size_t *acl_text_len,
                          archive_string_conv *sc)

{
  uint uVar1;
  size_t *psVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  char cVar8;
  size_t sVar9;
  archive_acl_entry *paVar11;
  char *pcVar12;
  int iVar13;
  archive_acl *paVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char *name;
  size_t len;
  char *local_68;
  char *local_60;
  archive_acl *local_58;
  archive_string_conv *local_50;
  size_t local_48;
  char **local_40;
  size_t *local_38;
  long lVar10;
  
  local_50 = sc;
  if (acl->acl_text != (char *)0x0) {
    free(acl->acl_text);
    acl->acl_text = (char *)0x0;
  }
  *acl_text = (char *)0x0;
  if (acl_text_len != (size_t *)0x0) {
    *acl_text_len = 0;
  }
  paVar11 = acl->acl_head;
  if (paVar11 == (archive_acl_entry *)0x0) {
    wVar4 = L'\0';
  }
  else {
    sVar9 = 0;
    iVar13 = 0;
    local_58 = acl;
    local_40 = acl_text;
    local_38 = acl_text_len;
    do {
      wVar4 = paVar11->type;
      if ((wVar4 & flags) != 0) {
        wVar3 = archive_mstring_get_mbs_l(&paVar11->name,&local_60,&local_48,local_50);
        if (wVar3 != L'\0') goto LAB_00453bf8;
        sVar6 = sVar9 + 8;
        if (((uint)wVar4 >> 9 & 1) == 0) {
          sVar6 = sVar9;
        }
        if (((uint)flags >> 0xb & 1) == 0) {
          sVar6 = sVar9;
        }
        iVar13 = iVar13 + 1;
        lVar10 = sVar6 + 6 + local_48;
        if (local_60 == (char *)0x0) {
          lVar10 = sVar6 + 0x13;
        }
        if (local_48 == 0) {
          lVar10 = sVar6 + 0x13;
        }
        sVar9 = lVar10 + 0x13;
      }
      paVar11 = paVar11->next;
    } while (paVar11 != (archive_acl_entry *)0x0);
    wVar4 = L'\0';
    if (iVar13 != 0) {
      sVar6 = sVar9 + 0x20;
      if (iVar13 < 1) {
        sVar6 = sVar9;
      }
      if (((uint)flags >> 8 & 1) == 0) {
        sVar6 = sVar9;
      }
      pcVar5 = (char *)malloc(sVar6);
      local_58->acl_text = pcVar5;
      if (pcVar5 == (char *)0x0) {
LAB_00453bf8:
        wVar4 = L'\xffffffff';
      }
      else {
        paVar14 = local_58;
        local_68 = pcVar5;
        if (((uint)flags >> 8 & 1) != 0) {
          uVar1 = local_58->mode;
          builtin_strncpy(pcVar5,"user",5);
          sVar9 = strlen(pcVar5);
          (pcVar5 + sVar9)[0] = ':';
          (pcVar5 + sVar9)[1] = ':';
          cVar8 = 'r';
          if ((uVar1 >> 8 & 1) == 0) {
            cVar8 = '-';
          }
          pcVar5[sVar9 + 2] = cVar8;
          pcVar5[sVar9 + 5] = ',';
          pcVar12 = pcVar5 + sVar9 + 6;
          pcVar12[0] = 'g';
          pcVar12[1] = 'r';
          pcVar12[2] = 'o';
          pcVar12[3] = 'u';
          (pcVar5 + sVar9 + 10)[0] = 'p';
          (pcVar5 + sVar9 + 10)[1] = '\0';
          auVar16._0_4_ = -(uint)((uVar1 & 0x10) == 0);
          auVar16._4_4_ = -(uint)((uVar1 & 0x20) == 0);
          auVar16._8_4_ = -(uint)((uVar1 & 0x40) == 0);
          auVar16._12_4_ = -(uint)((uVar1 & 0x80) == 0);
          auVar15._0_4_ = -(uint)((uVar1 & 1) == 0);
          auVar15._4_4_ = -(uint)((uVar1 & 2) == 0);
          auVar15._8_4_ = -(uint)((uVar1 & 4) == 0);
          auVar15._12_4_ = -(uint)((uVar1 & 8) == 0);
          auVar16 = packssdw(auVar15,auVar16);
          auVar16 = packsswb(auVar16,auVar16);
          cVar8 = 'w';
          if ((auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar8 = '-';
          }
          pcVar5[sVar9 + 3] = cVar8;
          cVar8 = 'x';
          if ((auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar8 = '-';
          }
          pcVar5[sVar9 + 4] = cVar8;
          sVar6 = strlen(pcVar5 + sVar9 + 6);
          lVar10 = sVar6 + sVar9;
          pcVar12 = pcVar5 + lVar10 + 0xc;
          (pcVar5 + lVar10 + 6)[0] = ':';
          (pcVar5 + lVar10 + 6)[1] = ':';
          cVar8 = 'r';
          if ((auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar8 = '-';
          }
          pcVar5[lVar10 + 8] = cVar8;
          cVar8 = 'w';
          if ((auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar8 = '-';
          }
          pcVar5[lVar10 + 9] = cVar8;
          cVar8 = 'x';
          if ((auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar8 = '-';
          }
          pcVar5[lVar10 + 10] = cVar8;
          pcVar5[lVar10 + 0xb] = ',';
          pcVar12[0] = 'o';
          pcVar12[1] = 't';
          pcVar12[2] = 'h';
          pcVar12[3] = 'e';
          (pcVar5 + lVar10 + 0x10)[0] = 'r';
          (pcVar5 + lVar10 + 0x10)[1] = '\0';
          sVar7 = strlen(pcVar12);
          paVar14 = local_58;
          lVar10 = sVar7 + sVar6 + sVar9;
          local_68 = pcVar5 + lVar10 + 0x11;
          (pcVar5 + lVar10 + 0xc)[0] = ':';
          (pcVar5 + lVar10 + 0xc)[1] = ':';
          cVar8 = 'r';
          if ((auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar8 = '-';
          }
          pcVar5[lVar10 + 0xe] = cVar8;
          cVar8 = 'w';
          if ((auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar8 = '-';
          }
          pcVar5[lVar10 + 0xf] = cVar8;
          cVar8 = 'x';
          if ((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            cVar8 = '-';
          }
          pcVar5[lVar10 + 0x10] = cVar8;
          *local_68 = '\0';
          paVar11 = local_58->acl_head;
          if (paVar11 != (archive_acl_entry *)0x0) {
            do {
              if ((paVar11->type & L'Ā') != L'\0') {
                wVar4 = archive_mstring_get_mbs_l(&paVar11->name,&local_60,&local_48,local_50);
                if (wVar4 != L'\0') goto LAB_00453bf8;
                *local_68 = ',';
                wVar4 = L'\xffffffff';
                if (((uint)flags >> 10 & 1) != 0) {
                  wVar4 = paVar11->id;
                }
                local_68 = local_68 + 1;
                append_entry(&local_68,(char *)0x0,paVar11->tag,local_60,paVar11->permset,wVar4);
              }
              paVar11 = paVar11->next;
            } while (paVar11 != (archive_acl_entry *)0x0);
          }
        }
        wVar4 = L'\0';
        if (((uint)flags >> 9 & 1) != 0) {
          iVar13 = 0;
          pcVar5 = (char *)0x0;
          if (((uint)flags >> 0xb & 1) != 0) {
            pcVar5 = "default:";
          }
          for (paVar11 = paVar14->acl_head; paVar11 != (archive_acl_entry *)0x0;
              paVar11 = paVar11->next) {
            if ((paVar11->type & L'Ȁ') != L'\0') {
              wVar3 = archive_mstring_get_mbs_l(&paVar11->name,&local_60,&local_48,local_50);
              if (wVar3 != L'\0') goto LAB_00453bf8;
              if (0 < iVar13) {
                *local_68 = ',';
                local_68 = local_68 + 1;
              }
              wVar3 = L'\xffffffff';
              if (((uint)flags >> 10 & 1) != 0) {
                wVar3 = paVar11->id;
              }
              append_entry(&local_68,pcVar5,paVar11->tag,local_60,paVar11->permset,wVar3);
              iVar13 = iVar13 + 1;
            }
          }
        }
        psVar2 = local_38;
        pcVar5 = paVar14->acl_text;
        *local_40 = pcVar5;
        if (local_38 != (size_t *)0x0) {
          sVar9 = strlen(pcVar5);
          *psVar2 = sVar9;
        }
      }
    }
  }
  return wVar4;
}

Assistant:

int
archive_acl_text_l(struct archive_acl *acl, int flags,
    const char **acl_text, size_t *acl_text_len,
    struct archive_string_conv *sc)
{
	int count;
	size_t length;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	size_t len;
	int id, r;
	char *p;

	if (acl->acl_text != NULL) {
		free (acl->acl_text);
		acl->acl_text = NULL;
	}

	*acl_text = NULL;
	if (acl_text_len != NULL)
		*acl_text_len = 0;
	separator = ',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (len > 0 && name != NULL)
				length += len;
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (0);

	/* Now, allocate the string and actually populate it. */
	p = acl->acl_text = (char *)malloc(length);
	if (p == NULL)
		return (-1);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, NULL, ap->tag, name,
			    ap->permset, id);
			count++;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = "default:";
		else
			prefix = NULL;
		count = 0;
		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (count > 0)
				*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, prefix, ap->tag,
			    name, ap->permset, id);
			count ++;
		}
	}

	*acl_text = acl->acl_text;
	if (acl_text_len != NULL)
		*acl_text_len = strlen(acl->acl_text);
	return (0);
}